

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStreamComponent_EndPolling
                  (PaAlsaStreamComponent *self,pollfd *pfds,int *shouldPoll,int *xrun)

{
  int iVar1;
  undefined8 in_RAX;
  unsigned_short revents;
  ushort local_22;
  
  local_22 = (ushort)((ulong)in_RAX >> 0x30);
  iVar1 = snd_pcm_poll_descriptors_revents(self->pcm,pfds,self->nfds,&local_22);
  if (iVar1 < 0) {
    PaAlsaStreamComponent_EndPolling_cold_1();
    return -9999;
  }
  if (local_22 == 0) {
    if (self->useReventFix == 0) {
      return 0;
    }
  }
  else if (((local_22 & 8) != 0) || ((local_22 & 0x10) != 0)) {
    *xrun = 1;
    goto LAB_00113b13;
  }
  self->ready = 1;
LAB_00113b13:
  *shouldPoll = 0;
  return 0;
}

Assistant:

static PaError PaAlsaStreamComponent_EndPolling( PaAlsaStreamComponent* self, struct pollfd* pfds, int* shouldPoll, int* xrun )
{
    PaError result = paNoError;
    unsigned short revents;

    ENSURE_( alsa_snd_pcm_poll_descriptors_revents( self->pcm, pfds, self->nfds, &revents ), paUnanticipatedHostError );
    if( revents != 0 )
    {
        if( revents & POLLERR )
        {
            *xrun = 1;
        }
        else if( revents & POLLHUP )
        {
            *xrun = 1;
            PA_DEBUG(( "%s: revents has POLLHUP, processing as XRUN\n", __FUNCTION__ ));
        }
        else
            self->ready = 1;

        *shouldPoll = 0;
    }
    else /* (A zero revent occurred) */
        /* Work around an issue with Alsa older than 1.0.16 using some plugins (eg default with plug + dmix) where
         * POLLIN or POLLOUT are zeroed by Alsa-lib if _mmap_avail() is a few frames short of avail_min at period
         * boundary, possibly due to erratic dma interrupts at period boundary?  Treat as a valid event.
         */
        if( self->useReventFix )
        {
            self->ready = 1;
            *shouldPoll = 0;
        }

error:
    return result;
}